

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_value.hpp
# Opt level: O0

shared_ptr<chaiscript::Boxed_Value::Data> __thiscall
chaiscript::Boxed_Value::Object_Data::get<Unique_Ptr_Test_Class>
          (Object_Data *this,
          unique_ptr<Unique_Ptr_Test_Class,_std::default_delete<Unique_Ptr_Test_Class>_> *obj,
          bool t_return_value)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<chaiscript::Boxed_Value::Data> sVar1;
  undefined1 local_65 [13];
  shared_ptr<std::unique_ptr<Unique_Ptr_Test_Class,_std::default_delete<Unique_Ptr_Test_Class>_>_>
  local_58;
  Any local_48;
  Any local_40 [3];
  pointer local_28;
  pointer ptr;
  unique_ptr<Unique_Ptr_Test_Class,_std::default_delete<Unique_Ptr_Test_Class>_> *puStack_18;
  bool t_return_value_local;
  unique_ptr<Unique_Ptr_Test_Class,_std::default_delete<Unique_Ptr_Test_Class>_> *obj_local;
  
  ptr._7_1_ = t_return_value;
  puStack_18 = obj;
  obj_local = (unique_ptr<Unique_Ptr_Test_Class,_std::default_delete<Unique_Ptr_Test_Class>_> *)this
  ;
  local_28 = Catch::clara::std::
             unique_ptr<Unique_Ptr_Test_Class,_std::default_delete<Unique_Ptr_Test_Class>_>::get
                       (obj);
  detail::Get_Type_Info<Unique_Ptr_Test_Class>::get();
  std::
  make_shared<std::unique_ptr<Unique_Ptr_Test_Class,std::default_delete<Unique_Ptr_Test_Class>>,std::unique_ptr<Unique_Ptr_Test_Class,std::default_delete<Unique_Ptr_Test_Class>>>
            ((unique_ptr<Unique_Ptr_Test_Class,_std::default_delete<Unique_Ptr_Test_Class>_> *)
             &local_58);
  detail::Any::
  Any<std::shared_ptr<std::unique_ptr<Unique_Ptr_Test_Class,std::default_delete<Unique_Ptr_Test_Class>>>,void>
            (&local_48,&local_58);
  local_65[0] = 1;
  std::
  make_shared<chaiscript::Boxed_Value::Data,chaiscript::Type_Info,chaiscript::detail::Any,bool,Unique_Ptr_Test_Class*&,bool&>
            ((Type_Info *)this,local_40,(bool *)&local_48,(Unique_Ptr_Test_Class **)local_65,
             (bool *)&local_28);
  detail::Any::~Any(&local_48);
  Catch::clara::std::
  shared_ptr<std::unique_ptr<Unique_Ptr_Test_Class,_std::default_delete<Unique_Ptr_Test_Class>_>_>::
  ~shared_ptr(&local_58);
  sVar1.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<chaiscript::Boxed_Value::Data>)
         sVar1.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static auto get(std::unique_ptr<T> &&obj, bool t_return_value) {
        auto ptr = obj.get();
        return std::make_shared<Data>(detail::Get_Type_Info<T>::get(),
                                      chaiscript::detail::Any(std::make_shared<std::unique_ptr<T>>(std::move(obj))),
                                      true,
                                      ptr,
                                      t_return_value);
      }